

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void Js::DynamicProfileInfo::DumpProfiledValue(char16 *name,CallSiteInfo *callSiteInfo,uint count)

{
  Type TVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  PolymorphicCallSiteInfo *pPVar6;
  char16_t *pcVar7;
  char local_128 [8];
  char returnTypeStr [256];
  uint i_1;
  int j;
  uint i;
  uint count_local;
  CallSiteInfo *callSiteInfo_local;
  char16 *name_local;
  
  if (count != 0) {
    Output::Print(L"    %-16s(%2d):",name,(ulong)count);
    for (i_1 = 0; i_1 < count; i_1 = i_1 + 1) {
      pcVar7 = L" ";
      if (i_1 != 0 && i_1 % 10 == 0) {
        pcVar7 = L"\n                          ";
      }
      Output::Print(pcVar7);
      Output::Print(L"%2d:",(ulong)i_1);
      if (*(short *)&callSiteInfo[i_1].field_0x2 < 0) {
        Output::Print(L" poly");
        returnTypeStr[0xfc] = '\0';
        returnTypeStr[0xfd] = '\0';
        returnTypeStr[0xfe] = '\0';
        returnTypeStr[0xff] = '\0';
        for (; (uint)returnTypeStr._252_4_ < 4; returnTypeStr._252_4_ = returnTypeStr._252_4_ + 1) {
          pPVar6 = Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::operator->
                             ((WriteBarrierPtr<Js::PolymorphicCallSiteInfo> *)
                              &callSiteInfo[i_1].u.functionData);
          if (pPVar6->functionIds[(int)returnTypeStr._252_4_] != 0xfffffffc) {
            pPVar6 = Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::operator->
                               ((WriteBarrierPtr<Js::PolymorphicCallSiteInfo> *)
                                &callSiteInfo[i_1].u.functionData);
            uVar2 = pPVar6->sourceIds[(int)returnTypeStr._252_4_];
            pPVar6 = Memory::WriteBarrierPtr<Js::PolymorphicCallSiteInfo>::operator->
                               ((WriteBarrierPtr<Js::PolymorphicCallSiteInfo> *)
                                &callSiteInfo[i_1].u.functionData);
            Output::Print(L" %4d:%4d",(ulong)uVar2,
                          (ulong)pPVar6->functionIds[(int)returnTypeStr._252_4_]);
          }
        }
      }
      else {
        TVar1 = callSiteInfo[i_1].u.functionData.sourceId;
        if (TVar1 == 0xfffffffc) {
          if (callSiteInfo[i_1].u.functionData.functionId == 0xffffffff) {
            Output::Print(L"  mix");
          }
          else if (callSiteInfo[i_1].u.functionData.functionId == 0xfffffffe) {
            Output::Print(L"    x");
          }
          else if (callSiteInfo[i_1].u.functionData.functionId == 0xfffffffd) {
            Output::Print(L"  !fn");
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                        ,0x65b,"(false)","false");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
        }
        else if (TVar1 == 0xfffffffe) {
          Output::Print(L" b%03d",(ulong)callSiteInfo[i_1].u.functionData.functionId);
        }
        else if (TVar1 == 0xffffffff) {
          Output::Print(L" ????");
        }
        else {
          Output::Print(L" %4d:%4d",(ulong)callSiteInfo[i_1].u.functionData.sourceId,
                        (ulong)callSiteInfo[i_1].u.functionData.functionId);
        }
      }
    }
    Output::Print(L"\n");
    Output::Print(L"    %-16s(%2d):",L"Callsite RetType",(ulong)count);
    returnTypeStr[0xf8] = '\0';
    returnTypeStr[0xf9] = '\0';
    returnTypeStr[0xfa] = '\0';
    returnTypeStr[0xfb] = '\0';
    for (; (uint)returnTypeStr._248_4_ < count; returnTypeStr._248_4_ = returnTypeStr._248_4_ + 1) {
      pcVar7 = L" ";
      if (returnTypeStr._248_4_ != 0 && (uint)returnTypeStr._248_4_ % 10 == 0) {
        pcVar7 = L"\n                          ";
      }
      Output::Print(pcVar7);
      Output::Print(L"%2d:",(ulong)(uint)returnTypeStr._248_4_);
      ValueType::ToString(&callSiteInfo[(uint)returnTypeStr._248_4_].returnType,
                          (char (*) [256])local_128);
      Output::Print(L"  %S",local_128);
    }
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void DynamicProfileInfo::DumpProfiledValue(char16 const * name, CallSiteInfo * callSiteInfo, uint count)
    {
        if (count != 0)
        {
            Output::Print(_u("    %-16s(%2d):"), name, count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:"), i);
                if (!callSiteInfo[i].isPolymorphic)
                {
                    switch (callSiteInfo[i].u.functionData.sourceId)
                    {
                    case NoSourceId:
                        Output::Print(_u(" ????"));
                        break;

                    case BuiltInSourceId:
                        Output::Print(_u(" b%03d"), callSiteInfo[i].u.functionData.functionId);
                        break;

                    case InvalidSourceId:
                        if (callSiteInfo[i].u.functionData.functionId == CallSiteMixed)
                        {
                            Output::Print(_u("  mix"));
                        }
                        else if (callSiteInfo[i].u.functionData.functionId == CallSiteCrossContext)
                        {
                            Output::Print(_u("    x"));
                        }
                        else if (callSiteInfo[i].u.functionData.functionId == CallSiteNonFunction)
                        {
                            Output::Print(_u("  !fn"));
                        }
                        else
                        {
                            Assert(false);
                        }
                        break;

                    default:
                        Output::Print(_u(" %4d:%4d"), callSiteInfo[i].u.functionData.sourceId, callSiteInfo[i].u.functionData.functionId);
                        break;
                    };
                }
                else
                {
                    Output::Print(_u(" poly"));
                    for (int j = 0; j < DynamicProfileInfo::maxPolymorphicInliningSize; j++)
                    {
                        if (callSiteInfo[i].u.polymorphicCallSiteInfo->functionIds[j] != CallSiteNoInfo)
                        {
                            Output::Print(_u(" %4d:%4d"), callSiteInfo[i].u.polymorphicCallSiteInfo->sourceIds[j], callSiteInfo[i].u.polymorphicCallSiteInfo->functionIds[j]);
                        }
                    }
                }
            }
            Output::Print(_u("\n"));

            Output::Print(_u("    %-16s(%2d):"), _u("Callsite RetType"), count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:"), i);
                char returnTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                callSiteInfo[i].returnType.ToString(returnTypeStr);
                Output::Print(_u("  %S"), returnTypeStr);
            }
            Output::Print(_u("\n"));
        }
    }